

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogManager.cpp
# Opt level: O0

void __thiscall
helics::LogManager::updateRemote(LogManager *this,GlobalFederateId destination,int level)

{
  bool bVar1;
  iterator this_00;
  int in_EDX;
  GlobalFederateId in_ESI;
  vector<std::pair<helics::GlobalFederateId,_int>,_std::allocator<std::pair<helics::GlobalFederateId,_int>_>_>
  *in_RDI;
  pair<helics::GlobalFederateId,_int> *rl;
  iterator __end1;
  iterator __begin1;
  vector<std::pair<helics::GlobalFederateId,_int>,_std::allocator<std::pair<helics::GlobalFederateId,_int>_>_>
  *__range1;
  undefined4 in_stack_ffffffffffffffc0;
  GlobalFederateId in_stack_ffffffffffffffc4;
  reference in_stack_ffffffffffffffc8;
  __normal_iterator<std::pair<helics::GlobalFederateId,_int>_*,_std::vector<std::pair<helics::GlobalFederateId,_int>,_std::allocator<std::pair<helics::GlobalFederateId,_int>_>_>_>
  local_28;
  vector<std::pair<helics::GlobalFederateId,_int>,_std::allocator<std::pair<helics::GlobalFederateId,_int>_>_>
  *local_20;
  int local_14;
  undefined4 in_stack_fffffffffffffff8;
  
  local_20 = in_RDI + 2;
  local_14 = in_EDX;
  local_28._M_current =
       (pair<helics::GlobalFederateId,_int> *)
       std::
       vector<std::pair<helics::GlobalFederateId,_int>,_std::allocator<std::pair<helics::GlobalFederateId,_int>_>_>
       ::begin(in_RDI);
  this_00 = std::
            vector<std::pair<helics::GlobalFederateId,_int>,_std::allocator<std::pair<helics::GlobalFederateId,_int>_>_>
            ::end(in_RDI);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<std::pair<helics::GlobalFederateId,_int>_*,_std::vector<std::pair<helics::GlobalFederateId,_int>,_std::allocator<std::pair<helics::GlobalFederateId,_int>_>_>_>
                      ((__normal_iterator<std::pair<helics::GlobalFederateId,_int>_*,_std::vector<std::pair<helics::GlobalFederateId,_int>,_std::allocator<std::pair<helics::GlobalFederateId,_int>_>_>_>
                        *)CONCAT44(in_stack_ffffffffffffffc4.gid,in_stack_ffffffffffffffc0),
                       (__normal_iterator<std::pair<helics::GlobalFederateId,_int>_*,_std::vector<std::pair<helics::GlobalFederateId,_int>,_std::allocator<std::pair<helics::GlobalFederateId,_int>_>_>_>
                        *)in_RDI);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      std::
      vector<std::pair<helics::GlobalFederateId,int>,std::allocator<std::pair<helics::GlobalFederateId,int>>>
      ::emplace_back<helics::GlobalFederateId&,int&>
                ((vector<std::pair<helics::GlobalFederateId,_int>,_std::allocator<std::pair<helics::GlobalFederateId,_int>_>_>
                  *)this_00._M_current,&in_stack_ffffffffffffffc8->first,
                 (int *)CONCAT44(in_stack_ffffffffffffffc4.gid,in_stack_ffffffffffffffc0));
      updateMaxLogLevel((LogManager *)CONCAT44(in_ESI.gid,in_stack_fffffffffffffff8));
      return;
    }
    in_stack_ffffffffffffffc4.gid = in_ESI.gid;
    in_stack_ffffffffffffffc8 =
         __gnu_cxx::
         __normal_iterator<std::pair<helics::GlobalFederateId,_int>_*,_std::vector<std::pair<helics::GlobalFederateId,_int>,_std::allocator<std::pair<helics::GlobalFederateId,_int>_>_>_>
         ::operator*(&local_28);
    in_ESI.gid = in_stack_ffffffffffffffc4.gid;
    bVar1 = GlobalFederateId::operator==
                      (&in_stack_ffffffffffffffc8->first,in_stack_ffffffffffffffc4);
    if (bVar1) break;
    __gnu_cxx::
    __normal_iterator<std::pair<helics::GlobalFederateId,_int>_*,_std::vector<std::pair<helics::GlobalFederateId,_int>,_std::allocator<std::pair<helics::GlobalFederateId,_int>_>_>_>
    ::operator++(&local_28);
  }
  in_stack_ffffffffffffffc8->second = local_14;
  return;
}

Assistant:

void LogManager::updateRemote(GlobalFederateId destination, int level)
{
    for (auto& rl : remoteTargets) {
        if (rl.first == destination) {
            rl.second = level;
            return;
        }
    }
    remoteTargets.emplace_back(destination, level);
    updateMaxLogLevel();
}